

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::MergeFrom(ExtensionSet *this,ExtensionSet *other)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (other->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(other->extensions_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    InternalExtensionMergeFrom(this,p_Var1[1]._M_color,(Extension *)&p_Var1[1]._M_parent);
  }
  return;
}

Assistant:

void ExtensionSet::MergeFrom(const ExtensionSet& other) {
  for (ExtensionMap::const_iterator iter = other.extensions_.begin();
       iter != other.extensions_.end(); ++iter) {
    const Extension& other_extension = iter->second;
    InternalExtensionMergeFrom(iter->first, other_extension);
  }
}